

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xvcmpgtsp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_ptr arg4;
  TCGv_i32 retval;
  uintptr_t o;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    arg2 = gen_vsr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5);
    arg3 = gen_vsr_ptr(tcg_ctx,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
    arg4 = gen_vsr_ptr(tcg_ctx,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    if ((ctx->opcode & 0x400) == 0) {
      retval = tcg_temp_new_i32(tcg_ctx);
      gen_helper_xvcmpgtsp(tcg_ctx,retval,tcg_ctx->cpu_env,arg2,arg3,arg4);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
    }
    else {
      gen_helper_xvcmpgtsp(tcg_ctx,cpu_crf[6],tcg_ctx->cpu_env,arg2,arg3,arg4);
    }
    gen_helper_float_check_status(tcg_ctx,tcg_ctx->cpu_env);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xscvqpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 opc;
    TCGv_ptr xt, xb;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    opc = tcg_const_i32(tcg_ctx, ctx->opcode);
    xt = gen_vsr_ptr(tcg_ctx, xT(ctx->opcode));
    xb = gen_vsr_ptr(tcg_ctx, xB(ctx->opcode));
    gen_helper_xscvqpdp(tcg_ctx, tcg_ctx->cpu_env, opc, xt, xb);
    tcg_temp_free_i32(tcg_ctx, opc);
    tcg_temp_free_ptr(tcg_ctx, xt);
    tcg_temp_free_ptr(tcg_ctx, xb);
}